

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::PostEmscripten::optimizeExceptions::OptimizeInvokes::create(OptimizeInvokes *this)

{
  long in_RSI;
  OptimizeInvokes *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::OptimizeInvokes,std::map<wasm::Function*,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info,std::less<wasm::Function*>,std::allocator<std::pair<wasm::Function*const,wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::Info>>>&,wasm::TableUtils::FlatTable&>
            ((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
              *)&stack0xffffffffffffffe0,*(FlatTable **)(in_RSI + 0x108));
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::OptimizeInvokes,std::default_delete<wasm::PostEmscripten::optimizeExceptions(wasm::Module*)::OptimizeInvokes>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<OptimizeInvokes,_std::default_delete<OptimizeInvokes>_> *)
             &stack0xffffffffffffffe0);
  std::unique_ptr<OptimizeInvokes,_std::default_delete<OptimizeInvokes>_>::~unique_ptr
            ((unique_ptr<OptimizeInvokes,_std::default_delete<OptimizeInvokes>_> *)
             &stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<OptimizeInvokes>(map, flatTable);
      }